

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int luaO_rawarith(lua_State *L,int op,TValue *p1,TValue *p2,TValue *res)

{
  int iVar1;
  lua_Integer lVar2;
  lua_Integer lVar3;
  lua_Number lVar4;
  TValue *io_3;
  TValue *io_2;
  lua_Number n2_1;
  lua_Number n1_1;
  TValue *io_1;
  lua_Number n2;
  lua_Number n1;
  TValue *io;
  lua_Integer i2;
  lua_Integer i1;
  TValue *res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *plStack_18;
  int op_local;
  lua_State *L_local;
  
  i1 = (lua_Integer)res;
  res_local = p2;
  p2_local = p1;
  p1_local._4_4_ = op;
  plStack_18 = L;
  if (1 < op - 4U) {
    if ((op - 7U < 5) || (op == 0xd)) {
      if (p1->tt_ == 0x13) {
        if (p1->tt_ != 0x13) {
          __assert_fail("((((p1))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                        ,0x7e,
                        "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                       );
        }
        i2 = (p1->value_).i;
      }
      else {
        iVar1 = luaV_tointegerns(p1,&i2,F2Ieq);
        if (iVar1 == 0) {
          return 0;
        }
      }
      if (res_local->tt_ == 0x13) {
        if (res_local->tt_ != 0x13) {
          __assert_fail("((((p2))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                        ,0x7e,
                        "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                       );
        }
        io = (TValue *)(res_local->value_).gc;
      }
      else {
        iVar1 = luaV_tointegerns(res_local,(lua_Integer *)&io,F2Ieq);
        if (iVar1 == 0) {
          return 0;
        }
      }
      lVar3 = i1;
      lVar2 = intarith(plStack_18,p1_local._4_4_,i2,(lua_Integer)io);
      *(lua_Integer *)lVar3 = lVar2;
      *(undefined2 *)(lVar3 + 8) = 0x13;
      return 1;
    }
    if ((p1->tt_ == 0x13) && (p2->tt_ == 0x13)) {
      if (p1->tt_ != 0x13) {
        __assert_fail("((((p1))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x8f,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      if (p2->tt_ != 0x13) {
        __assert_fail("((((p2))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x8f,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      lVar3 = intarith(L,op,(p1->value_).i,(p2->value_).i);
      (res->value_).i = lVar3;
      res->tt_ = 0x13;
      return 1;
    }
    if (p1->tt_ == 3) {
      if (p1->tt_ != 3) {
        __assert_fail("((((p1))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x92,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      n2_1 = (p1->value_).n;
    }
    else {
      if (p1->tt_ != 0x13) {
        return 0;
      }
      if (p1->tt_ != 0x13) {
        __assert_fail("((((p1))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x92,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      n2_1 = (lua_Number)(p1->value_).i;
    }
    if (p2->tt_ == 3) {
      if (p2->tt_ != 3) {
        __assert_fail("((((p2))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x92,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      io_2 = (TValue *)(p2->value_).gc;
    }
    else {
      if (p2->tt_ != 0x13) {
        return 0;
      }
      if (p2->tt_ != 0x13) {
        __assert_fail("((((p2))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x92,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      io_2 = (TValue *)(double)(p2->value_).i;
    }
    lVar4 = numarith(L,op,n2_1,(lua_Number)io_2);
    (res->value_).n = lVar4;
    res->tt_ = 3;
    return 1;
  }
  if (p1->tt_ == 3) {
    if (p1->tt_ != 3) {
      __assert_fail("((((p1))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                    ,0x86,
                    "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)")
      ;
    }
    n2 = (p1->value_).n;
LAB_0014929b:
    if (p2->tt_ == 3) {
      if (p2->tt_ != 3) {
        __assert_fail("((((p2))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x86,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      io_1 = (TValue *)(p2->value_).gc;
    }
    else {
      if (p2->tt_ != 0x13) goto LAB_00149383;
      if (p2->tt_ != 0x13) {
        __assert_fail("((((p2))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x86,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      io_1 = (TValue *)(double)(p2->value_).i;
    }
    lVar4 = numarith(L,op,n2,(lua_Number)io_1);
    (res->value_).n = lVar4;
    res->tt_ = 3;
    L_local._4_4_ = 1;
  }
  else {
    if (p1->tt_ == 0x13) {
      if (p1->tt_ != 0x13) {
        __assert_fail("((((p1))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x86,
                      "int luaO_rawarith(lua_State *, int, const TValue *, const TValue *, TValue *)"
                     );
      }
      n2 = (lua_Number)(p1->value_).i;
      goto LAB_0014929b;
    }
LAB_00149383:
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

int luaO_rawarith (lua_State *L, int op, const TValue *p1, const TValue *p2,
                   TValue *res) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR:
    case LUA_OPBNOT: {  /* operate only on integers */
      lua_Integer i1; lua_Integer i2;
      if (tointegerns(p1, &i1) && tointegerns(p2, &i2)) {
        setivalue(res, intarith(L, op, i1, i2));
        return 1;
      }
      else return 0;  /* fail */
    }
    case LUA_OPDIV: case LUA_OPPOW: {  /* operate only on floats */
      lua_Number n1; lua_Number n2;
      if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
    default: {  /* other operations */
      lua_Number n1; lua_Number n2;
      if (ttisinteger(p1) && ttisinteger(p2)) {
        setivalue(res, intarith(L, op, ivalue(p1), ivalue(p2)));
        return 1;
      }
      else if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
  }
}